

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O2

void bssl::SSL_SESSION_list_remove(SSL_CTX *ctx,SSL_SESSION *session)

{
  SSL_SESSION **ppSVar1;
  SSL_SESSION *pSVar2;
  SSL_SESSION *pSVar3;
  SSL_SESSION **ppSVar4;
  
  pSVar2 = session->next;
  if ((pSVar2 != (SSL_SESSION *)0x0) && (pSVar3 = session->prev, pSVar3 != (SSL_SESSION *)0x0)) {
    ppSVar1 = &ctx->session_cache_tail;
    ppSVar4 = &ctx->session_cache_head;
    if (pSVar2 == (SSL_SESSION *)ppSVar1) {
      if (pSVar3 == (SSL_SESSION *)ppSVar4) {
        *ppSVar4 = (SSL_SESSION *)0x0;
        ctx->session_cache_tail = (SSL_SESSION *)0x0;
      }
      else {
        *ppSVar1 = pSVar3;
        pSVar3->next = (SSL_SESSION *)ppSVar1;
      }
    }
    else if (pSVar3 == (SSL_SESSION *)ppSVar4) {
      *ppSVar4 = pSVar2;
      pSVar2->prev = (SSL_SESSION *)ppSVar4;
    }
    else {
      pSVar2->prev = pSVar3;
      session->prev->next = pSVar2;
    }
    session->prev = (SSL_SESSION *)0x0;
    session->next = (SSL_SESSION *)0x0;
  }
  return;
}

Assistant:

static void SSL_SESSION_list_remove(SSL_CTX *ctx, SSL_SESSION *session) {
  if (session->next == NULL || session->prev == NULL) {
    return;
  }

  if (session->next == (SSL_SESSION *)&ctx->session_cache_tail) {
    // last element in list
    if (session->prev == (SSL_SESSION *)&ctx->session_cache_head) {
      // only one element in list
      ctx->session_cache_head = NULL;
      ctx->session_cache_tail = NULL;
    } else {
      ctx->session_cache_tail = session->prev;
      session->prev->next = (SSL_SESSION *)&(ctx->session_cache_tail);
    }
  } else {
    if (session->prev == (SSL_SESSION *)&ctx->session_cache_head) {
      // first element in list
      ctx->session_cache_head = session->next;
      session->next->prev = (SSL_SESSION *)&(ctx->session_cache_head);
    } else {  // middle of list
      session->next->prev = session->prev;
      session->prev->next = session->next;
    }
  }
  session->prev = session->next = NULL;
}